

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Object am_get_db_from_list(Am_Object *proto,Am_Value_List *db_list,int *cnt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  void *this;
  Am_Value *pAVar5;
  Am_Object *this_00;
  int *in_RCX;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List local_50 [2];
  undefined1 local_29;
  int *local_28;
  int *cnt_local;
  Am_Value_List *db_list_local;
  Am_Object *proto_local;
  Am_Object *w;
  
  local_29 = 0;
  local_28 = in_RCX;
  cnt_local = cnt;
  db_list_local = db_list;
  proto_local = proto;
  Am_Object::Am_Object(proto);
  bVar1 = Am_Value_List::Empty((Am_Value_List *)cnt_local);
  if (bVar1) {
    Am_Object::Create(&local_58,(char *)db_list_local);
    Am_Object::operator=(proto,&local_58);
    Am_Object::~Am_Object(&local_58);
    Am_Object::Am_Object(&local_60,proto);
    Am_Object::Add_Part(&Am_Screen,&local_60,true,0);
    Am_Object::~Am_Object(&local_60);
  }
  else {
    Am_Value_List::Pop(local_50,SUB81(cnt_local,0));
    Am_Object::operator=(proto,(Am_Value *)local_50);
    Am_Value::~Am_Value((Am_Value *)local_50);
  }
  if ((am_sdebug & 1U) != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"window  ");
    poVar4 = operator<<(poVar4,proto);
    this = (void *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this,std::flush<char,std::char_traits<char>>);
  }
  pAVar5 = Am_Object::Get(&Am_Screen,0x66,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(proto,0x66,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  this_00 = Am_Object::Set(proto,100,(iVar2 - iVar3) / 2 + *local_28 * 0x19,0);
  pAVar5 = Am_Object::Get(&Am_Screen,0x67,0);
  iVar2 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(proto,0x67,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Object::Set(this_00,0x65,(iVar2 - iVar3) / 2 + *local_28 * 0x19,0);
  *local_28 = *local_28 + 1;
  return (Am_Object)(Am_Object_Data *)proto;
}

Assistant:

Am_Object
am_get_db_from_list(Am_Object &proto, Am_Value_List &db_list, int &cnt)
{
  Am_Object w;
  if (!db_list.Empty()) {
    w = db_list.Pop();
  } else {
    w = proto.Create();
    Am_Screen.Add_Part(w);
  }
  if (am_sdebug)
    std::cout << "window  " << w << std::endl << std::flush;

  w.Set(Am_LEFT,
        ((int)Am_Screen.Get(Am_WIDTH) - (int)w.Get(Am_WIDTH)) / 2 + cnt * 25)
      .Set(Am_TOP, ((int)Am_Screen.Get(Am_HEIGHT) - (int)w.Get(Am_HEIGHT)) / 2 +
                       cnt * 25);
  cnt++;
  return w;
}